

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastBR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ulong *puVar3;
  SerialArena *this;
  __int_type_conflict3 _Var4;
  __pointer_type pSVar5;
  uint uVar6;
  Rep *pRVar7;
  string *psVar8;
  string *s;
  ulong uVar9;
  char *pcVar10;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  ParseContext *extraout_RDX_01;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 unaff_RBP;
  ushort *ptr_00;
  ushort *puVar11;
  ulong uVar12;
  uint *puVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  undefined1 auVar14 [16];
  pair<const_char_*,_int> pVar15;
  LogMessageFatal local_40 [16];
  
  if (data.field_0._0_2_ != 0) {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  uVar2 = *(ushort *)ptr;
  puVar3 = (ulong *)this_00[2].data;
  if (puVar3 != (ulong *)0x0) {
    ptr_00 = (ushort *)ptr;
    auVar14 = __tls_get_addr(&PTR_004d49d0);
    ctx_00 = auVar14._8_8_;
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(auVar14._0_8_ + 8))->data;
    if (data.field_0.data == (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar3) {
      this = *(SerialArena **)(auVar14._0_8_ + 0x10);
      data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
      if (((ulong)data.field_0 & 1) == 0) {
        uVar6 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
      }
      else {
        pRVar7 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
        uVar6 = pRVar7->allocated_size;
        ctx_00 = extraout_RDX;
      }
      if (uVar6 == *(uint *)(this_00 + 1)) {
        do {
          bVar1 = (byte)*(ushort *)((long)ptr + 2);
          puVar11 = (ushort *)(ulong)bVar1;
          uVar6 = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            pVar15 = ReadSizeFallback((char *)((long)ptr + 2),(uint)bVar1);
            uVar6 = pVar15.second;
            ptr_00 = puVar11;
          }
          else {
            pVar15._8_8_ = ctx_00;
            pVar15.first = (char *)((long)ptr + 3);
          }
          ctx_00 = pVar15._8_8_;
          puVar11 = (ushort *)pVar15.first;
          if (puVar11 == (ushort *)0x0) {
            ptr = (char *)0x0;
          }
          else {
            _Var4 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
            if (_Var4 != 0) {
              uVar9 = _Var4 - 0x20;
              (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar9;
              pSVar5 = (this->string_block_)._M_b._M_p;
              uVar12 = (ulong)pSVar5->allocated_size_ - 0x10;
              if (uVar12 < uVar9) {
                psVar8 = absl::lts_20240722::log_internal::
                         MakeCheckOpString<unsigned_long,unsigned_long>
                                   (uVar9,uVar12,"offset <= effective_size()");
              }
              else {
                psVar8 = (string *)0x0;
              }
              if (psVar8 != (string *)0x0) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          (local_40,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/string_block.h"
                           ,0xa2,*(undefined8 *)(psVar8 + 8),*(undefined8 *)psVar8);
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
              }
              unaff_RBP.data = (long)&pSVar5[-1].next_ + _Var4;
            }
            data.field_0 = unaff_RBP;
            if (_Var4 == 0) {
              data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                             SerialArena::AllocateFromStringBlockFallback(this);
            }
            *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
            *(undefined8 *)((long)data.field_0 + 8) = 0;
            *(undefined1 *)((long)data.field_0 + 0x10) = 0;
            RepeatedPtrFieldBase::AddAllocatedForParse
                      ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
            ptr = EpsCopyInputStream::ReadString
                            (&ctx->super_EpsCopyInputStream,(char *)puVar11,uVar6,
                             (string *)data.field_0);
            ctx_00 = extraout_RDX_00;
            ptr_00 = puVar11;
          }
          if ((ushort *)ptr == (ushort *)0x0) goto LAB_002999ff;
          if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_002999cb;
        } while (*(ushort *)ptr == uVar2);
        goto LAB_00299980;
      }
    }
  }
  do {
    ptr_00 = (ushort *)((long)ptr + 2);
    s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
    ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
    ctx_00 = extraout_RDX_01;
    if ((ushort *)ptr == (ushort *)0x0) {
LAB_002999ff:
      pcVar10 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
      return pcVar10;
    }
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_002999cb;
  } while (*(ushort *)ptr == uVar2);
LAB_00299980:
  if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar6 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar6 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar9 = (ulong)(uVar6 & 0xfffffff8);
    pcVar10 = (char *)(**(code **)(&table[1].has_bits_offset + uVar9))
                                (msg,ptr,ctx,
                                 (ulong)*(ushort *)ptr ^
                                 *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2),table,hasbits);
    return pcVar10;
  }
LAB_002999cb:
  if ((ulong)table->has_bits_offset != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail();
    }
    *puVar13 = *puVar13 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<
      uint16_t, RepeatedPtrField<std::string>, kNoUtf8>(PROTOBUF_TC_PARAM_PASS);
}